

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdial.cpp
# Opt level: O0

void __thiscall QDial::mouseReleaseEvent(QDial *this,QMouseEvent *e)

{
  MouseButton MVar1;
  Int IVar2;
  MouseButton MVar3;
  QDialPrivate *this_00;
  socklen_t *__addr_len;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *__addr;
  QSinglePointEvent *in_RSI;
  QSinglePointEvent *in_RDI;
  long in_FS_OFFSET;
  QPoint *in_stack_00000008;
  QDialPrivate *in_stack_00000010;
  QDialPrivate *d;
  undefined8 in_stack_ffffffffffffffa8;
  uint mask;
  undefined1 down;
  QFlagsStorageHelper<Qt::MouseButton,_4> local_c;
  long local_8;
  
  mask = (uint)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QDial *)0x56b3ff);
  QSinglePointEvent::buttons(in_RDI);
  MVar1 = QSinglePointEvent::button(in_RSI);
  MVar1 = MVar1 ^ MouseButtonMask;
  local_c.super_QFlagsStorage<Qt::MouseButton>.i =
       (QFlagsStorage<Qt::MouseButton>)
       QFlags<Qt::MouseButton>::operator&((QFlags<Qt::MouseButton> *)in_RDI,mask);
  IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c);
  __addr_len = (socklen_t *)(ulong)IVar2;
  down = true;
  __addr = extraout_RDX;
  if (IVar2 == 0) {
    MVar3 = QSinglePointEvent::button(in_RSI);
    down = MVar3 != LeftButton;
    __addr = extraout_RDX_00;
  }
  if ((bool)down == false) {
    QEvent::accept((QEvent *)in_RSI,MVar1,__addr,__addr_len);
    QSinglePointEvent::position((QSinglePointEvent *)0x56b48d);
    QPointF::toPoint((QPointF *)this_00);
    QDialPrivate::valueFromPoint(in_stack_00000010,in_stack_00000008);
    QAbstractSlider::setValue((QAbstractSlider *)in_RSI,(int)((ulong)this_00 >> 0x20));
    QAbstractSlider::setSliderDown((QAbstractSlider *)this_00,(bool)down);
  }
  else {
    QEvent::ignore((QEvent *)in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDial::mouseReleaseEvent(QMouseEvent * e)
{
    Q_D(QDial);
    if (e->buttons() & (~e->button()) ||
       (e->button() != Qt::LeftButton)) {
        e->ignore();
        return;
    }
    e->accept();
    setValue(d->valueFromPoint(e->position().toPoint()));
    setSliderDown(false);
}